

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index_hash.c
# Opt level: O3

lzma_ret hash_append(lzma_index_hash_info *info,lzma_vli unpadded_size,lzma_vli uncompressed_size)

{
  uint32_t uVar1;
  uint32_t uVar2;
  lzma_ret extraout_EAX;
  lzma_vli sizes [2];
  lzma_vli local_38;
  lzma_vli local_30;
  
  if (-1 < (long)unpadded_size) {
    info->blocks_size = info->blocks_size + (unpadded_size + 3 & 0xfffffffffffffffc);
    info->uncompressed_size = info->uncompressed_size + uncompressed_size;
    uVar1 = lzma_vli_size(unpadded_size);
    uVar2 = lzma_vli_size(uncompressed_size);
    info->count = info->count + 1;
    info->index_list_size = (ulong)(uVar2 + uVar1) + info->index_list_size;
    local_38 = unpadded_size;
    local_30 = uncompressed_size;
    lzma_check_update(&info->check,LZMA_CHECK_SHA256,(uint8_t *)&local_38,0x10);
    return extraout_EAX;
  }
  __assert_fail("vli <= LZMA_VLI_MAX",
                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmliblzma/liblzma/common/index.h"
                ,0x29,"lzma_vli vli_ceil4(lzma_vli)");
}

Assistant:

static lzma_ret
hash_append(lzma_index_hash_info *info, lzma_vli unpadded_size,
		lzma_vli uncompressed_size)
{
	info->blocks_size += vli_ceil4(unpadded_size);
	info->uncompressed_size += uncompressed_size;
	info->index_list_size += lzma_vli_size(unpadded_size)
			+ lzma_vli_size(uncompressed_size);
	++info->count;

	const lzma_vli sizes[2] = { unpadded_size, uncompressed_size };
	lzma_check_update(&info->check, LZMA_CHECK_BEST,
			(const uint8_t *)(sizes), sizeof(sizes));

	return LZMA_OK;
}